

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.h
# Opt level: O0

void __thiscall
ccs::Loader::loadCcsStream
          (Loader *this,istream *stream,string *fileName,DagBuilder *dag,
          ImportResolver *importResolver)

{
  pointer *this_00;
  bool bVar1;
  undefined1 local_a8 [48];
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inProgress;
  Nested ast;
  ImportResolver *importResolver_local;
  DagBuilder *dag_local;
  string *fileName_local;
  istream *stream_local;
  Loader *this_local;
  
  this_00 = &inProgress.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ccs::ast::Nested::Nested((Nested *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  bVar1 = parseCcsStream(this,stream,fileName,importResolver,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_78,(Nested *)this_00);
  if (bVar1) {
    DagBuilder::buildContext((DagBuilder *)(local_a8 + 0x10));
    DagBuilder::buildContext((DagBuilder *)local_a8);
    ccs::ast::Nested::addTo
              ((Nested *)
               &inProgress.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(P *)(local_a8 + 0x10),
               (P *)local_a8);
    std::shared_ptr<ccs::BuildContext>::~shared_ptr((shared_ptr<ccs::BuildContext> *)local_a8);
    std::shared_ptr<ccs::BuildContext>::~shared_ptr
              ((shared_ptr<ccs::BuildContext> *)(local_a8 + 0x10));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  ccs::ast::Nested::~Nested
            ((Nested *)
             &inProgress.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void loadCcsStream(std::istream &stream, const std::string &fileName,
      DagBuilder &dag, ImportResolver &importResolver) {
    ast::Nested ast;
    std::vector<std::string> inProgress;
    if (parseCcsStream(stream, fileName, importResolver, inProgress, ast)) {
      // everything parsed, no errors. now it's safe to modify the dag...
      ast.addTo(dag.buildContext(), dag.buildContext());
    }
    // otherwise, errors already reported, don't modify the dag...
  }